

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int resolve_len_ran_interval(ly_ctx *ctx,char *str_restr,lys_type *type,len_ran_intv **ret)

{
  int iVar1;
  len_ran_intv *plVar2;
  ushort **ppuVar3;
  ulonglong uVar4;
  longlong lVar5;
  char *pcVar6;
  len_ran_intv *local_a0;
  len_ran_intv *intv;
  len_ran_intv *tmp_intv;
  len_ran_intv *tmp_local_intv;
  len_ran_intv *local_intv;
  char *ptr;
  char *seg_ptr;
  ulong uStack_68;
  uint8_t local_fdig;
  uint64_t local_umax;
  uint64_t local_umin;
  int64_t local_fmax;
  int64_t local_fmin;
  int64_t local_smax;
  int64_t local_smin;
  len_ran_intv **pplStack_30;
  int kind;
  len_ran_intv **ret_local;
  lys_type *type_local;
  char *str_restr_local;
  ly_ctx *ctx_local;
  
  local_smax = 0;
  local_fmin = 0;
  uStack_68 = 0;
  seg_ptr._7_1_ = '\0';
  tmp_local_intv = (len_ran_intv *)0x0;
  tmp_intv = (len_ran_intv *)0x0;
  local_a0 = (len_ran_intv *)0x0;
  type_local = (lys_type *)str_restr;
  switch(type->base) {
  case LY_TYPE_BINARY:
    local_smin._4_4_ = 0;
    local_umax = 0;
    uStack_68 = 0xffffffffffffffff;
    if ((str_restr == (char *)0x0) && ((type->info).bits.bit != (lys_type_bit *)0x0)) {
      type_local = (lys_type *)*(type->info).ident.ref;
    }
    break;
  default:
    return -1;
  case LY_TYPE_DEC64:
    local_smin._4_4_ = 2;
    local_fmax = -0x8000000000000000;
    local_umin = 0x7fffffffffffffff;
    seg_ptr._7_1_ = (type->info).dec64.dig;
    if ((str_restr == (char *)0x0) && ((type->info).bits.bit != (lys_type_bit *)0x0)) {
      type_local = (lys_type *)*(type->info).ident.ref;
    }
    break;
  case LY_TYPE_STRING:
    local_smin._4_4_ = 0;
    local_umax = 0;
    uStack_68 = 0xffffffffffffffff;
    if ((str_restr == (char *)0x0) && ((type->info).bits.bit != (lys_type_bit *)0x0)) {
      type_local = (lys_type *)*(type->info).ident.ref;
    }
    break;
  case LY_TYPE_INT8:
    local_smin._4_4_ = 1;
    local_smax = -0x80;
    local_fmin = 0x7f;
    if ((str_restr == (char *)0x0) && ((type->info).bits.bit != (lys_type_bit *)0x0)) {
      type_local = (lys_type *)*(type->info).ident.ref;
    }
    break;
  case LY_TYPE_UINT8:
    local_smin._4_4_ = 0;
    local_umax = 0;
    uStack_68 = 0xff;
    if ((str_restr == (char *)0x0) && ((type->info).bits.bit != (lys_type_bit *)0x0)) {
      type_local = (lys_type *)*(type->info).ident.ref;
    }
    break;
  case LY_TYPE_INT16:
    local_smin._4_4_ = 1;
    local_smax = -0x8000;
    local_fmin = 0x7fff;
    if ((str_restr == (char *)0x0) && ((type->info).bits.bit != (lys_type_bit *)0x0)) {
      type_local = (lys_type *)*(type->info).ident.ref;
    }
    break;
  case LY_TYPE_UINT16:
    local_smin._4_4_ = 0;
    local_umax = 0;
    uStack_68 = 0xffff;
    if ((str_restr == (char *)0x0) && ((type->info).bits.bit != (lys_type_bit *)0x0)) {
      type_local = (lys_type *)*(type->info).ident.ref;
    }
    break;
  case LY_TYPE_INT32:
    local_smin._4_4_ = 1;
    local_smax = -0x80000000;
    local_fmin = 0x7fffffff;
    if ((str_restr == (char *)0x0) && ((type->info).bits.bit != (lys_type_bit *)0x0)) {
      type_local = (lys_type *)*(type->info).ident.ref;
    }
    break;
  case LY_TYPE_UINT32:
    local_smin._4_4_ = 0;
    local_umax = 0;
    uStack_68 = 0xffffffff;
    if ((str_restr == (char *)0x0) && ((type->info).bits.bit != (lys_type_bit *)0x0)) {
      type_local = (lys_type *)*(type->info).ident.ref;
    }
    break;
  case LY_TYPE_INT64:
    local_smin._4_4_ = 1;
    local_smax = -0x8000000000000000;
    local_fmin = 0x7fffffffffffffff;
    if ((str_restr == (char *)0x0) && ((type->info).bits.bit != (lys_type_bit *)0x0)) {
      type_local = (lys_type *)*(type->info).ident.ref;
    }
    break;
  case LY_TYPE_UINT64:
    local_smin._4_4_ = 0;
    local_umax = 0;
    uStack_68 = 0xffffffffffffffff;
    if ((str_restr == (char *)0x0) && ((type->info).bits.bit != (lys_type_bit *)0x0)) {
      type_local = (lys_type *)*(type->info).ident.ref;
    }
  }
  pplStack_30 = ret;
  ret_local = (len_ran_intv **)type;
  str_restr_local = (char *)ctx;
  if (type->der != (lys_tpdf *)0x0) {
    iVar1 = resolve_len_ran_interval(ctx,(char *)0x0,&type->der->type,&local_a0);
    if (iVar1 != 0) {
      return -1;
    }
    if ((local_a0 != (len_ran_intv *)0x0) && (local_a0->kind != local_smin._4_4_)) {
      __assert_fail("!intv || (intv->kind == kind)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                    ,0xbdf,
                    "int resolve_len_ran_interval(struct ly_ctx *, const char *, struct lys_type *, struct len_ran_intv **)"
                   );
    }
  }
  if (type_local == (lys_type *)0x0) {
    *pplStack_30 = local_a0;
    return 0;
  }
  if (local_a0 != (len_ran_intv *)0x0) {
    intv = local_a0;
    if (local_smin._4_4_ == 0) {
      local_umax = (local_a0->value).uval.min;
    }
    else if (local_smin._4_4_ == 1) {
      local_smax = (local_a0->value).sval.min;
    }
    else if (local_smin._4_4_ == 2) {
      local_fmax = (local_a0->value).sval.min;
    }
    for (; intv->next != (len_ran_intv *)0x0; intv = intv->next) {
    }
    if (local_smin._4_4_ == 0) {
      uStack_68 = (intv->value).uval.max;
    }
    else if (local_smin._4_4_ == 1) {
      local_fmin = (intv->value).sval.max;
    }
    else if (local_smin._4_4_ == 2) {
      local_umin = (intv->value).uval.max;
    }
  }
  ptr = (char *)type_local;
  intv = (len_ran_intv *)0x0;
  while( true ) {
    if (tmp_intv == (len_ran_intv *)0x0) {
      if (tmp_local_intv != (len_ran_intv *)0x0) {
        __assert_fail("!local_intv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                      ,0xc06,
                      "int resolve_len_ran_interval(struct ly_ctx *, const char *, struct lys_type *, struct len_ran_intv **)"
                     );
      }
      tmp_intv = (len_ran_intv *)malloc(0x28);
      tmp_local_intv = tmp_intv;
    }
    else {
      plVar2 = (len_ran_intv *)malloc(0x28);
      tmp_intv->next = plVar2;
      tmp_intv = tmp_intv->next;
    }
    if (tmp_intv == (len_ran_intv *)0x0) {
      ly_log((ly_ctx *)str_restr_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "resolve_len_ran_interval");
      goto LAB_0011ac4b;
    }
    tmp_intv->kind = (uint8_t)local_smin._4_4_;
    tmp_intv->type = (lys_type *)ret_local;
    tmp_intv->next = (len_ran_intv *)0x0;
    local_intv = (len_ran_intv *)ptr;
    while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)(char)local_intv->kind] & 0x2000) != 0) {
      local_intv = (len_ran_intv *)&local_intv->field_0x1;
    }
    ppuVar3 = __ctype_b_loc();
    if (((((*ppuVar3)[(int)(char)local_intv->kind] & 0x800) == 0) && (local_intv->kind != '+')) &&
       (local_intv->kind != '-')) {
      iVar1 = strncmp((char *)local_intv,"min",3);
      if (iVar1 == 0) {
        if (local_smin._4_4_ == 0) {
          (tmp_intv->value).uval.min = local_umax;
        }
        else if (local_smin._4_4_ == 1) {
          (tmp_intv->value).sval.min = local_smax;
        }
        else if (local_smin._4_4_ == 2) {
          (tmp_intv->value).sval.min = local_fmax;
        }
      }
      else {
        iVar1 = strncmp((char *)local_intv,"max",3);
        if (iVar1 != 0) goto LAB_0011ac4b;
        if (local_smin._4_4_ == 0) {
          (tmp_intv->value).uval.min = uStack_68;
        }
        else if (local_smin._4_4_ == 1) {
          (tmp_intv->value).sval.min = local_fmin;
        }
        else if (local_smin._4_4_ == 2) {
          (tmp_intv->value).uval.min = local_umin;
        }
      }
      local_intv = (len_ran_intv *)&local_intv->field_0x3;
    }
    else if (local_smin._4_4_ == 0) {
      uVar4 = strtoull((char *)local_intv,(char **)&local_intv,10);
      (tmp_intv->value).uval.min = uVar4;
    }
    else if (local_smin._4_4_ == 1) {
      lVar5 = strtoll((char *)local_intv,(char **)&local_intv,10);
      (tmp_intv->value).sval.min = lVar5;
    }
    else if ((local_smin._4_4_ == 2) &&
            (iVar1 = parse_range_dec64((char **)&local_intv,seg_ptr._7_1_,
                                       (int64_t *)&tmp_intv->value), iVar1 != 0)) {
      ly_vlog((ly_ctx *)str_restr_local,LYE_INARG,LY_VLOG_NONE,(void *)0x0,local_intv,"range");
      goto LAB_0011ac4b;
    }
    while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)(char)local_intv->kind] & 0x2000) != 0) {
      local_intv = (len_ran_intv *)&local_intv->field_0x1;
    }
    if ((local_intv->kind == '|') || (local_intv->kind == '\0')) {
      if (local_smin._4_4_ == 0) {
        (tmp_intv->value).uval.max = (tmp_intv->value).uval.min;
      }
      else if (local_smin._4_4_ == 1) {
        (tmp_intv->value).uval.max = (tmp_intv->value).uval.min;
      }
      else if (local_smin._4_4_ == 2) {
        (tmp_intv->value).uval.max = (tmp_intv->value).uval.min;
      }
    }
    else {
      iVar1 = strncmp((char *)local_intv,"..",2);
      if (iVar1 != 0) goto LAB_0011ac4b;
      local_intv = (len_ran_intv *)&local_intv->field_0x2;
      while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)(char)local_intv->kind] & 0x2000) != 0) {
        local_intv = (len_ran_intv *)&local_intv->field_0x1;
      }
      ppuVar3 = __ctype_b_loc();
      if (((((*ppuVar3)[(int)(char)local_intv->kind] & 0x800) == 0) && (local_intv->kind != '+')) &&
         (local_intv->kind != '-')) {
        iVar1 = strncmp((char *)local_intv,"max",3);
        if (iVar1 != 0) goto LAB_0011ac4b;
        if (local_smin._4_4_ == 0) {
          (tmp_intv->value).uval.max = uStack_68;
        }
        else if (local_smin._4_4_ == 1) {
          (tmp_intv->value).sval.max = local_fmin;
        }
        else if (local_smin._4_4_ == 2) {
          (tmp_intv->value).uval.max = local_umin;
        }
      }
      else if (local_smin._4_4_ == 0) {
        uVar4 = strtoull((char *)local_intv,(char **)&local_intv,10);
        (tmp_intv->value).uval.max = uVar4;
      }
      else if (local_smin._4_4_ == 1) {
        lVar5 = strtoll((char *)local_intv,(char **)&local_intv,10);
        (tmp_intv->value).sval.max = lVar5;
      }
      else if ((local_smin._4_4_ == 2) &&
              (iVar1 = parse_range_dec64((char **)&local_intv,seg_ptr._7_1_,
                                         &(tmp_intv->value).sval.max), iVar1 != 0)) {
        ly_vlog((ly_ctx *)str_restr_local,LYE_INARG,LY_VLOG_NONE,(void *)0x0,local_intv,"range");
        goto LAB_0011ac4b;
      }
    }
    if (local_smin._4_4_ == 0) {
      if (((((tmp_intv->value).uval.max < (tmp_intv->value).uval.min) ||
           ((tmp_intv->value).uval.min < local_umax)) || (uStack_68 < (tmp_intv->value).uval.max))
         || ((intv != (len_ran_intv *)0x0 && ((tmp_intv->value).uval.min <= (intv->value).uval.max))
            )) goto LAB_0011ac4b;
    }
    else if (local_smin._4_4_ == 1) {
      if (((tmp_intv->value).sval.max < (tmp_intv->value).sval.min) ||
         ((((tmp_intv->value).sval.min < local_smax || (local_fmin < (tmp_intv->value).sval.max)) ||
          ((intv != (len_ran_intv *)0x0 && ((tmp_intv->value).sval.min <= (intv->value).sval.max))))
         )) goto LAB_0011ac4b;
    }
    else if ((local_smin._4_4_ == 2) &&
            ((((tmp_intv->value).sval.max < (tmp_intv->value).sval.min ||
              ((tmp_intv->value).sval.min < local_fmax)) ||
             (((long)local_umin < (tmp_intv->value).sval.max ||
              ((intv != (len_ran_intv *)0x0 &&
               ((tmp_intv->value).sval.min <= (intv->value).sval.max)))))))) goto LAB_0011ac4b;
    pcVar6 = strchr(ptr,0x7c);
    if (pcVar6 == (char *)0x0) break;
    ptr = pcVar6 + 1;
    intv = tmp_intv;
  }
  if (local_a0 != (len_ran_intv *)0x0) {
    intv = local_a0;
    tmp_intv = tmp_local_intv;
    ptr = (char *)0x0;
LAB_0011a9e0:
    if (tmp_intv == (len_ran_intv *)0x0 || intv == (len_ran_intv *)0x0) goto LAB_0011abcc;
    if (local_smin._4_4_ == 0) {
      local_umax = (tmp_intv->value).uval.min;
      uStack_68 = (tmp_intv->value).uval.max;
      if (((intv->value).uval.min <= local_umax) && (local_umax <= (intv->value).uval.max)) {
        if ((intv->value).uval.max < uStack_68) goto LAB_0011ac4b;
        tmp_intv = tmp_intv->next;
        goto LAB_0011a9e0;
      }
    }
    else {
      if (local_smin._4_4_ == 1) {
        local_smax = (tmp_intv->value).sval.min;
        local_fmin = (tmp_intv->value).sval.max;
        if ((local_smax < (intv->value).sval.min) || ((intv->value).sval.max < local_smax))
        goto LAB_0011abb5;
        if ((intv->value).sval.max < local_fmin) goto LAB_0011ac4b;
        tmp_intv = tmp_intv->next;
        goto LAB_0011a9e0;
      }
      if (local_smin._4_4_ == 2) {
        local_fmax = (tmp_intv->value).sval.min;
        local_umin = (tmp_intv->value).uval.max;
        iVar1 = dec64cmp(local_fmax,seg_ptr._7_1_,(intv->value).sval.min,seg_ptr._7_1_);
        if ((iVar1 < 0) ||
           (iVar1 = dec64cmp(local_fmax,seg_ptr._7_1_,(intv->value).sval.max,seg_ptr._7_1_),
           0 < iVar1)) goto LAB_0011abb5;
        iVar1 = dec64cmp(local_umin,seg_ptr._7_1_,(intv->value).sval.max,seg_ptr._7_1_);
        if (0 < iVar1) goto LAB_0011ac4b;
        tmp_intv = tmp_intv->next;
        goto LAB_0011a9e0;
      }
    }
LAB_0011abb5:
    intv = intv->next;
    goto LAB_0011a9e0;
  }
LAB_0011abda:
  if (local_a0 == (len_ran_intv *)0x0) {
    local_a0 = tmp_local_intv;
  }
  else {
    for (intv = local_a0; intv->next != (len_ran_intv *)0x0; intv = intv->next) {
    }
    intv->next = tmp_local_intv;
  }
  *pplStack_30 = local_a0;
  return 0;
LAB_0011abcc:
  if (tmp_intv != (len_ran_intv *)0x0) {
LAB_0011ac4b:
    while (local_a0 != (len_ran_intv *)0x0) {
      intv = local_a0->next;
      free(local_a0);
      local_a0 = intv;
    }
    while (tmp_local_intv != (len_ran_intv *)0x0) {
      tmp_intv = tmp_local_intv->next;
      free(tmp_local_intv);
      tmp_local_intv = tmp_intv;
    }
    return -1;
  }
  goto LAB_0011abda;
}

Assistant:

int
resolve_len_ran_interval(struct ly_ctx *ctx, const char *str_restr, struct lys_type *type, struct len_ran_intv **ret)
{
    /* 0 - unsigned, 1 - signed, 2 - floating point */
    int kind;
    int64_t local_smin = 0, local_smax = 0, local_fmin, local_fmax;
    uint64_t local_umin, local_umax = 0;
    uint8_t local_fdig = 0;
    const char *seg_ptr, *ptr;
    struct len_ran_intv *local_intv = NULL, *tmp_local_intv = NULL, *tmp_intv, *intv = NULL;

    switch (type->base) {
    case LY_TYPE_BINARY:
        kind = 0;
        local_umin = 0;
        local_umax = 18446744073709551615UL;

        if (!str_restr && type->info.binary.length) {
            str_restr = type->info.binary.length->expr;
        }
        break;
    case LY_TYPE_DEC64:
        kind = 2;
        local_fmin = __INT64_C(-9223372036854775807) - __INT64_C(1);
        local_fmax = __INT64_C(9223372036854775807);
        local_fdig = type->info.dec64.dig;

        if (!str_restr && type->info.dec64.range) {
            str_restr = type->info.dec64.range->expr;
        }
        break;
    case LY_TYPE_INT8:
        kind = 1;
        local_smin = __INT64_C(-128);
        local_smax = __INT64_C(127);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_INT16:
        kind = 1;
        local_smin = __INT64_C(-32768);
        local_smax = __INT64_C(32767);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_INT32:
        kind = 1;
        local_smin = __INT64_C(-2147483648);
        local_smax = __INT64_C(2147483647);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_INT64:
        kind = 1;
        local_smin = __INT64_C(-9223372036854775807) - __INT64_C(1);
        local_smax = __INT64_C(9223372036854775807);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_UINT8:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(255);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_UINT16:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(65535);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_UINT32:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(4294967295);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_UINT64:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(18446744073709551615);

        if (!str_restr && type->info.num.range) {
            str_restr = type->info.num.range->expr;
        }
        break;
    case LY_TYPE_STRING:
        kind = 0;
        local_umin = __UINT64_C(0);
        local_umax = __UINT64_C(18446744073709551615);

        if (!str_restr && type->info.str.length) {
            str_restr = type->info.str.length->expr;
        }
        break;
    default:
        return -1;
    }

    /* process superior types */
    if (type->der) {
        if (resolve_len_ran_interval(ctx, NULL, &type->der->type, &intv)) {
            return -1;
        }
        assert(!intv || (intv->kind == kind));
    }

    if (!str_restr) {
        /* we do not have any restriction, return superior ones */
        *ret = intv;
        return EXIT_SUCCESS;
    }

    /* adjust local min and max */
    if (intv) {
        tmp_intv = intv;

        if (kind == 0) {
            local_umin = tmp_intv->value.uval.min;
        } else if (kind == 1) {
            local_smin = tmp_intv->value.sval.min;
        } else if (kind == 2) {
            local_fmin = tmp_intv->value.fval.min;
        }

        while (tmp_intv->next) {
            tmp_intv = tmp_intv->next;
        }

        if (kind == 0) {
            local_umax = tmp_intv->value.uval.max;
        } else if (kind == 1) {
            local_smax = tmp_intv->value.sval.max;
        } else if (kind == 2) {
            local_fmax = tmp_intv->value.fval.max;
        }
    }

    /* finally parse our restriction */
    seg_ptr = str_restr;
    tmp_intv = NULL;
    while (1) {
        if (!tmp_local_intv) {
            assert(!local_intv);
            local_intv = malloc(sizeof *local_intv);
            tmp_local_intv = local_intv;
        } else {
            tmp_local_intv->next = malloc(sizeof *tmp_local_intv);
            tmp_local_intv = tmp_local_intv->next;
        }
        LY_CHECK_ERR_GOTO(!tmp_local_intv, LOGMEM(ctx), error);

        tmp_local_intv->kind = kind;
        tmp_local_intv->type = type;
        tmp_local_intv->next = NULL;

        /* min */
        ptr = seg_ptr;
        while (isspace(ptr[0])) {
            ++ptr;
        }
        if (isdigit(ptr[0]) || (ptr[0] == '+') || (ptr[0] == '-')) {
            if (kind == 0) {
                tmp_local_intv->value.uval.min = strtoull(ptr, (char **)&ptr, 10);
            } else if (kind == 1) {
                tmp_local_intv->value.sval.min = strtoll(ptr, (char **)&ptr, 10);
            } else if (kind == 2) {
                if (parse_range_dec64(&ptr, local_fdig, &tmp_local_intv->value.fval.min)) {
                    LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, ptr, "range");
                    goto error;
                }
            }
        } else if (!strncmp(ptr, "min", 3)) {
            if (kind == 0) {
                tmp_local_intv->value.uval.min = local_umin;
            } else if (kind == 1) {
                tmp_local_intv->value.sval.min = local_smin;
            } else if (kind == 2) {
                tmp_local_intv->value.fval.min = local_fmin;
            }

            ptr += 3;
        } else if (!strncmp(ptr, "max", 3)) {
            if (kind == 0) {
                tmp_local_intv->value.uval.min = local_umax;
            } else if (kind == 1) {
                tmp_local_intv->value.sval.min = local_smax;
            } else if (kind == 2) {
                tmp_local_intv->value.fval.min = local_fmax;
            }

            ptr += 3;
        } else {
            goto error;
        }

        while (isspace(ptr[0])) {
            ptr++;
        }

        /* no interval or interval */
        if ((ptr[0] == '|') || !ptr[0]) {
            if (kind == 0) {
                tmp_local_intv->value.uval.max = tmp_local_intv->value.uval.min;
            } else if (kind == 1) {
                tmp_local_intv->value.sval.max = tmp_local_intv->value.sval.min;
            } else if (kind == 2) {
                tmp_local_intv->value.fval.max = tmp_local_intv->value.fval.min;
            }
        } else if (!strncmp(ptr, "..", 2)) {
            /* skip ".." */
            ptr += 2;
            while (isspace(ptr[0])) {
                ++ptr;
            }

            /* max */
            if (isdigit(ptr[0]) || (ptr[0] == '+') || (ptr[0] == '-')) {
                if (kind == 0) {
                    tmp_local_intv->value.uval.max = strtoull(ptr, (char **)&ptr, 10);
                } else if (kind == 1) {
                    tmp_local_intv->value.sval.max = strtoll(ptr, (char **)&ptr, 10);
                } else if (kind == 2) {
                    if (parse_range_dec64(&ptr, local_fdig, &tmp_local_intv->value.fval.max)) {
                        LOGVAL(ctx, LYE_INARG, LY_VLOG_NONE, NULL, ptr, "range");
                        goto error;
                    }
                }
            } else if (!strncmp(ptr, "max", 3)) {
                if (kind == 0) {
                    tmp_local_intv->value.uval.max = local_umax;
                } else if (kind == 1) {
                    tmp_local_intv->value.sval.max = local_smax;
                } else if (kind == 2) {
                    tmp_local_intv->value.fval.max = local_fmax;
                }
            } else {
                goto error;
            }
        } else {
            goto error;
        }

        /* check min and max in correct order */
        if (kind == 0) {
            /* current segment */
            if (tmp_local_intv->value.uval.min > tmp_local_intv->value.uval.max) {
                goto error;
            }
            if (tmp_local_intv->value.uval.min < local_umin || tmp_local_intv->value.uval.max > local_umax) {
                goto error;
            }
            /* segments sholud be ascending order */
            if (tmp_intv && (tmp_intv->value.uval.max >= tmp_local_intv->value.uval.min)) {
                goto error;
            }
        } else if (kind == 1) {
            if (tmp_local_intv->value.sval.min > tmp_local_intv->value.sval.max) {
                goto error;
            }
            if (tmp_local_intv->value.sval.min < local_smin || tmp_local_intv->value.sval.max > local_smax) {
                goto error;
            }
            if (tmp_intv && (tmp_intv->value.sval.max >= tmp_local_intv->value.sval.min)) {
                goto error;
            }
        } else if (kind == 2) {
            if (tmp_local_intv->value.fval.min > tmp_local_intv->value.fval.max) {
                goto error;
            }
            if (tmp_local_intv->value.fval.min < local_fmin || tmp_local_intv->value.fval.max > local_fmax) {
                goto error;
            }
            if (tmp_intv && (tmp_intv->value.fval.max >= tmp_local_intv->value.fval.min)) {
                /* fraction-digits value is always the same (it cannot be changed in derived types) */
                goto error;
            }
        }

        /* next segment (next OR) */
        seg_ptr = strchr(seg_ptr, '|');
        if (!seg_ptr) {
            break;
        }
        seg_ptr++;
        tmp_intv = tmp_local_intv;
    }

    /* check local restrictions against superior ones */
    if (intv) {
        tmp_intv = intv;
        tmp_local_intv = local_intv;

        while (tmp_local_intv && tmp_intv) {
            /* reuse local variables */
            if (kind == 0) {
                local_umin = tmp_local_intv->value.uval.min;
                local_umax = tmp_local_intv->value.uval.max;

                /* it must be in this interval */
                if ((local_umin >= tmp_intv->value.uval.min) && (local_umin <= tmp_intv->value.uval.max)) {
                    /* this interval is covered, next one */
                    if (local_umax <= tmp_intv->value.uval.max) {
                        tmp_local_intv = tmp_local_intv->next;
                        continue;
                    /* ascending order of restrictions -> fail */
                    } else {
                        goto error;
                    }
                }
            } else if (kind == 1) {
                local_smin = tmp_local_intv->value.sval.min;
                local_smax = tmp_local_intv->value.sval.max;

                if ((local_smin >= tmp_intv->value.sval.min) && (local_smin <= tmp_intv->value.sval.max)) {
                    if (local_smax <= tmp_intv->value.sval.max) {
                        tmp_local_intv = tmp_local_intv->next;
                        continue;
                    } else {
                        goto error;
                    }
                }
            } else if (kind == 2) {
                local_fmin = tmp_local_intv->value.fval.min;
                local_fmax = tmp_local_intv->value.fval.max;

                 if ((dec64cmp(local_fmin, local_fdig, tmp_intv->value.fval.min, local_fdig) > -1)
                        && (dec64cmp(local_fmin, local_fdig, tmp_intv->value.fval.max, local_fdig) < 1)) {
                    if (dec64cmp(local_fmax, local_fdig, tmp_intv->value.fval.max, local_fdig) < 1) {
                        tmp_local_intv = tmp_local_intv->next;
                        continue;
                    } else {
                        goto error;
                    }
                }
            }

            tmp_intv = tmp_intv->next;
        }

        /* some interval left uncovered -> fail */
        if (tmp_local_intv) {
            goto error;
        }
    }

    /* append the local intervals to all the intervals of the superior types, return it all */
    if (intv) {
        for (tmp_intv = intv; tmp_intv->next; tmp_intv = tmp_intv->next);
        tmp_intv->next = local_intv;
    } else {
        intv = local_intv;
    }
    *ret = intv;

    return EXIT_SUCCESS;

error:
    while (intv) {
        tmp_intv = intv->next;
        free(intv);
        intv = tmp_intv;
    }
    while (local_intv) {
        tmp_local_intv = local_intv->next;
        free(local_intv);
        local_intv = tmp_local_intv;
    }

    return -1;
}